

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

int Ifn_NtkParseInt_rec(char *pStr,Ifn_Ntk_t *p,char **ppFinal,int *piNode)

{
  uint uVar1;
  char cVar2;
  uint uVar3;
  char *pcVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  int iVar9;
  char cVar10;
  size_t __n;
  char *local_90;
  uint local_84;
  Ifn_Ntk_t *local_80;
  int *local_78;
  char **local_70;
  int pFanins [11];
  
  local_78 = piNode;
  local_84 = Inf_ManOpenSymb(pStr);
  local_90 = pStr + 1;
  pcVar4 = Ifn_Symbs[local_84];
  cVar2 = *pcVar4;
  if (*pStr != cVar2) {
    __assert_fail("*pStr == Open",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                  ,0xef,"char *Ifn_NtkParseFindClosingParenthesis(char *, char, char)");
  }
  iVar9 = 0;
  pcVar8 = local_90;
  cVar10 = cVar2;
  while( true ) {
    if (cVar10 == '\0') {
      *ppFinal = (char *)0x0;
      Ifn_ErrorMessage("For symbol \'%c\' cannot find matching symbol \'%c\'.\n",
                       (ulong)(uint)(int)*pcVar4,(ulong)(uint)(int)pcVar4[1]);
      return 0;
    }
    iVar9 = (iVar9 + (uint)(cVar10 == cVar2)) - (uint)(cVar10 == pcVar4[1]);
    if (iVar9 == 0) break;
    cVar10 = *pcVar8;
    pcVar8 = pcVar8 + 1;
  }
  *ppFinal = (char *)0x0;
  iVar9 = -local_84;
  __n = 0;
  local_80 = p;
  local_70 = ppFinal;
  do {
    uVar1 = local_84;
    pcVar4 = local_90;
    if (pcVar8 + -1 <= local_90) {
      if (local_90 != pcVar8 + -1) {
        __assert_fail("pStr == pLim",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                      ,0x112,"int Ifn_NtkParseInt_rec(char *, Ifn_Ntk_t *, char **, int *)");
      }
      iVar6 = *local_78;
      *local_78 = iVar6 + 1;
      uVar3 = *(uint *)(local_80->Nodes + iVar6);
      uVar7 = uVar3 & 0xfffffff8;
      *(uint *)(local_80->Nodes + iVar6) = uVar7 | local_84;
      if ((uVar3 & 0xf8) == 0) {
        *(uint *)(local_80->Nodes + iVar6) = uVar7 - iVar9;
        memcpy(local_80->Nodes[iVar6].Fanins,pFanins,__n);
        *local_70 = pcVar8;
        if (__n != 0xc && uVar1 == 5) {
          Ifn_ErrorMessage("MUX should have exactly three fanins.\n");
          return 0;
        }
        return 1;
      }
      __assert_fail("pObj->nFanins == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                    ,0x115,"int Ifn_NtkParseInt_rec(char *, Ifn_Ntk_t *, char **, int *)");
    }
    if (__n == 0x2c) {
      __assert_fail("nFanins < IFN_INS",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                    ,0x106,"int Ifn_NtkParseInt_rec(char *, Ifn_Ntk_t *, char **, int *)");
    }
    cVar2 = *local_90;
    uVar1 = (int)cVar2 - 0x61;
    if ((byte)uVar1 < 0x1a) {
      *(uint *)((long)pFanins + __n) = uVar1 & 0xff;
      local_90 = local_90 + 1;
    }
    else {
      iVar6 = Inf_ManOpenSymb(local_90);
      piVar5 = local_78;
      if (iVar6 == 0) {
        Ifn_ErrorMessage("Substring \"%s\" contans unrecognized symbol \'%c\'.\n",pcVar4,
                         (ulong)(uint)(int)cVar2);
        return 0;
      }
      iVar6 = Ifn_NtkParseInt_rec(pcVar4,local_80,&local_90,local_78);
      if (iVar6 == 0) {
        return 0;
      }
      *(int *)((long)pFanins + __n) = *piVar5 + -1;
    }
    __n = __n + 4;
    iVar9 = iVar9 + -8;
  } while( true );
}

Assistant:

int Ifn_NtkParseInt_rec( char * pStr, Ifn_Ntk_t * p, char ** ppFinal, int * piNode )
{
    Ifn_Obj_t * pObj;
    int nFanins = 0, pFanins[IFN_INS];
    int Type = Inf_ManOpenSymb( pStr );
    char * pLim = Ifn_NtkParseFindClosingParenthesis( pStr++, Ifn_Symbs[Type][0], Ifn_Symbs[Type][1] );
    *ppFinal = NULL;
    if ( pLim == NULL )
        return Ifn_ErrorMessage( "For symbol \'%c\' cannot find matching symbol \'%c\'.\n", Ifn_Symbs[Type][0], Ifn_Symbs[Type][1] );
    while ( pStr < pLim )
    {
        assert( nFanins < IFN_INS );
        if ( pStr[0] >= 'a' && pStr[0] <= 'z' )
            pFanins[nFanins++] = pStr[0] - 'a', pStr++; 
        else if ( Inf_ManOpenSymb(pStr) )
        {
            if ( !Ifn_NtkParseInt_rec( pStr, p, &pStr, piNode ) )
                return 0;
            pFanins[nFanins++] = *piNode - 1;
        }
        else
            return Ifn_ErrorMessage( "Substring \"%s\" contans unrecognized symbol \'%c\'.\n", pStr, pStr[0] );
    }
    assert( pStr == pLim );
    pObj = p->Nodes + (*piNode)++;
    pObj->Type = Type;
    assert( pObj->nFanins == 0 );
    pObj->nFanins = nFanins;
    memcpy( pObj->Fanins, pFanins, sizeof(int) * nFanins );
    *ppFinal = pLim + 1;
    if ( Type == IFN_DSD_MUX && nFanins != 3 )
        return Ifn_ErrorMessage( "MUX should have exactly three fanins.\n" );
    return 1;
}